

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::setReverbCompatibilityMode(Synth *this,bool mt32CompatibleMode)

{
  bool bVar1;
  int local_18;
  int i;
  bool oldReverbEnabled;
  bool mt32CompatibleMode_local;
  Synth *this_local;
  
  if (((this->opened & 1U) != 0) &&
     (bVar1 = isMT32ReverbCompatibilityMode(this), bVar1 != mt32CompatibleMode)) {
    bVar1 = isReverbEnabled(this);
    setReverbEnabled(this,false);
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      if (this->reverbModels[local_18] != (BReverbModel *)0x0) {
        (*this->reverbModels[local_18]->_vptr_BReverbModel[1])();
      }
    }
    initReverbModels(this,mt32CompatibleMode);
    setReverbEnabled(this,bVar1);
    setReverbOutputGain(this,this->reverbOutputGain);
  }
  return;
}

Assistant:

void Synth::setReverbCompatibilityMode(bool mt32CompatibleMode) {
	if (!opened || (isMT32ReverbCompatibilityMode() == mt32CompatibleMode)) return;
	bool oldReverbEnabled = isReverbEnabled();
	setReverbEnabled(false);
	for (int i = REVERB_MODE_ROOM; i <= REVERB_MODE_TAP_DELAY; i++) {
		delete reverbModels[i];
	}
	initReverbModels(mt32CompatibleMode);
	setReverbEnabled(oldReverbEnabled);
	setReverbOutputGain(reverbOutputGain);
}